

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec2 __thiscall djb::microfacet::h2_to_u2(microfacet *this,vec3 *wm,vec3 *wi,args *args)

{
  vec2 extraout_XMM0_Qa;
  vec3 vVar1;
  undefined8 local_b0;
  float_t local_a8;
  vec3 local_a0;
  vec3 local_90;
  undefined8 local_80;
  vec3 wm_std;
  float_t local_68;
  vec3 local_60;
  vec3 local_50;
  undefined8 local_40;
  vec3 wi_std;
  args *args_local;
  vec3 *wi_local;
  vec3 *wm_local;
  microfacet *this_local;
  
  unique0x100000a5 = args;
  vVar1 = djb::operator*(&args->minv,wi);
  local_60.z = vVar1.z;
  local_50.z = local_60.z;
  local_60._0_8_ = vVar1._0_8_;
  local_50.x = local_60.x;
  local_50.y = local_60.y;
  join_0x00001240_0x00001200_ = normalize(&local_50);
  wi_std.x = local_68;
  local_40 = stack0xffffffffffffff90;
  vVar1 = djb::operator*(&stack0xffffffffffffffd0->mtra,wm);
  local_a0.z = vVar1.z;
  local_90.z = local_a0.z;
  local_a0._0_8_ = vVar1._0_8_;
  local_90.x = local_a0.x;
  local_90.y = local_a0.y;
  vVar1 = normalize(&local_90);
  local_a8 = vVar1.z;
  wm_std.x = local_a8;
  local_b0 = vVar1._0_8_;
  local_80 = local_b0;
  (*(this->super_brdf)._vptr_brdf[0xd])(this,&local_80,&local_40);
  return extraout_XMM0_Qa;
}

Assistant:

vec2
microfacet::h2_to_u2(
	const vec3 &wm, const vec3 &wi, const args &args
) const {
	vec3 wi_std = normalize(args.minv * wi);
	vec3 wm_std = normalize(args.mtra * wm);

	return h2_to_u2_std(wm_std, wi_std);
}